

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lookup.c
# Opt level: O0

parasail_matrix_t * parasail_matrix_lookup(char *matrixname)

{
  int iVar1;
  parasail_matrix_t *local_28;
  parasail_matrix_t *current;
  int index;
  parasail_matrix_t *matrix;
  char *matrixname_local;
  
  if (matrixname != (char *)0x0) {
    local_28 = parasail_matrices[0];
    current._4_4_ = 1;
    while (local_28 != (parasail_matrix_t *)0x0) {
      iVar1 = strcmp(matrixname,local_28->name);
      if (iVar1 == 0) {
        return local_28;
      }
      local_28 = parasail_matrices[current._4_4_];
      current._4_4_ = current._4_4_ + 1;
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

const parasail_matrix_t* parasail_matrix_lookup(const char *matrixname)
{
    const parasail_matrix_t *matrix = NULL;

    if (matrixname) {
        int index = 0;
        const parasail_matrix_t *current = parasail_matrices[index++];
        while (current) {
            if (0 == strcmp(matrixname, current->name)) {
                matrix = current;
                break;
            }
            current = parasail_matrices[index++];
        }
    }

    return matrix;
}